

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

curl_header * curl_easy_nextheader(CURL_conflict *easy,uint type,int request,curl_header *prev)

{
  void *pvVar1;
  int iVar2;
  Curl_header_store *check;
  size_t index;
  size_t amount;
  curl_header *hout;
  Curl_header_store *hs;
  Curl_llist_element *e;
  Curl_llist_element *pick;
  Curl_easy *data;
  curl_header *prev_local;
  int request_local;
  uint type_local;
  CURL_conflict *easy_local;
  
  index = 0;
  check = (Curl_header_store *)0x0;
  if ((easy->state).requests < request) {
    easy_local = (CURL_conflict *)0x0;
  }
  else {
    prev_local._0_4_ = request;
    if (request == -1) {
      prev_local._0_4_ = (easy->state).requests;
    }
    if (prev == (curl_header *)0x0) {
      e = (easy->state).httphdrs.head;
    }
    else {
      if (prev->anchor == (void *)0x0) {
        return (curl_header *)0x0;
      }
      e = *(Curl_llist_element **)((long)prev->anchor + 0x10);
    }
    while ((e != (Curl_llist_element *)0x0 &&
           (((*(byte *)((long)e->ptr + 0x2c) & type) == 0 ||
            (*(int *)((long)e->ptr + 0x28) != (int)prev_local))))) {
      e = e->next;
    }
    if (e == (Curl_llist_element *)0x0) {
      easy_local = (CURL_conflict *)0x0;
    }
    else {
      hout = (curl_header *)e->ptr;
      pick = (Curl_llist_element *)easy;
      data = (Curl_easy *)prev;
      prev_local._4_4_ = type;
      _request_local = easy;
      for (hs = (Curl_header_store *)(easy->state).httphdrs.head; hs != (Curl_header_store *)0x0;
          hs = (Curl_header_store *)(hs->node).next) {
        pvVar1 = (hs->node).ptr;
        iVar2 = Curl_strcasecompare((char *)hout->index,*(char **)((long)pvVar1 + 0x18));
        if (((iVar2 != 0) && (*(int *)((long)pvVar1 + 0x28) == (int)prev_local)) &&
           ((*(byte *)((long)pvVar1 + 0x2c) & prev_local._4_4_) != 0)) {
          index = index + 1;
        }
        if (hs == (Curl_header_store *)e) {
          check = (Curl_header_store *)(index - 1);
        }
      }
      copy_header_external
                ((Curl_easy *)pick,(Curl_header_store *)hout,(size_t)check,index,e,
                 (curl_header **)&amount);
      easy_local = (CURL_conflict *)amount;
    }
  }
  return (curl_header *)easy_local;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_element *pick;
  struct Curl_llist_element *e;
  struct Curl_header_store *hs;
  struct curl_header *hout;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = pick->next;
  }
  else
    pick = data->state.httphdrs.head;

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = pick->ptr;
      if((hs->type & type) && (hs->request == request))
        break;
      pick = pick->next;
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = pick->ptr;

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    struct Curl_header_store *check = e->ptr;
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(data, hs, index, amount, pick, &hout);
  return hout;
}